

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O0

void __thiscall crsGA::ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  size_t __n;
  reference this_00;
  type local_48;
  thread local_40;
  ulong local_38;
  size_t i;
  allocator<crsGA::ScopedThread> local_19;
  size_t local_18;
  size_t threads_local;
  ThreadPool *this_local;
  
  local_18 = threads;
  threads_local = (size_t)this;
  std::atomic<bool>::atomic(&this->stop,false);
  ThreadSafeQueue<std::function<void_()>_>::ThreadSafeQueue(&this->tasks);
  __n = local_18;
  std::allocator<crsGA::ScopedThread>::allocator(&local_19);
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::vector
            (&this->workers,__n,&local_19);
  std::allocator<crsGA::ScopedThread>::~allocator(&local_19);
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
    local_48.this = this;
    std::thread::thread<crsGA::ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_,,void>
              (&local_40,&local_48);
    this_00 = std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::operator[]
                        (&this->workers,local_38);
    ScopedThread::operator=(this_00,&local_40);
    std::thread::~thread(&local_40);
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(size_t threads) : stop(false),
                                                tasks(),
                                                workers(threads)
{
    for (size_t i = 0; i < threads; ++i)
        workers[i] = std::thread(
            [this] {
                while (!stop)
                {
                    runPendingTask();
                }
            });
}